

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
BinaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&,_const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&>
::streamReconstructedExpression
          (BinaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&,_const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&>
           *this,ostream *os)

{
  ComponentHandle<Position,_entityx::EntityManager> *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  StringRef in_stack_ffffffffffffff98;
  string local_30 [48];
  
  Detail::stringify<entityx::ComponentHandle<Position,entityx::EntityManager>>(in_RSI);
  Detail::stringify<entityx::ComponentHandle<Position,entityx::EntityManager>>(in_RSI);
  formatReconstructedExpression
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }